

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O0

void Abc_ExactStats(void)

{
  double local_90;
  double local_80;
  double local_70;
  double local_60;
  double local_50;
  double local_40;
  double local_30;
  double local_20;
  int local_c;
  int i;
  
  if (s_pSesStore == (Ses_Store_t *)0x0) {
    printf("BMS manager has not been started\n");
  }
  else {
    printf(
          "-------------------------------------------------------------------------------------------------------------------------------\n"
          );
    printf(
          "                                    0         1         2         3         4         5         6         7         8     total\n"
          );
    printf(
          "-------------------------------------------------------------------------------------------------------------------------------\n"
          );
    printf("number of considered cuts :");
    for (local_c = 0; local_c < 9; local_c = local_c + 1) {
      printf("%10lu",s_pSesStore->pCutCount[local_c]);
    }
    printf("%10lu\n",s_pSesStore->nCutCount);
    printf(" - trivial                :");
    for (local_c = 0; local_c < 9; local_c = local_c + 1) {
      printf("%10lu",s_pSesStore->pSynthesizedTrivial[local_c]);
    }
    printf("%10lu\n",s_pSesStore->nSynthesizedTrivial);
    printf(" - synth (imp)            :");
    for (local_c = 0; local_c < 9; local_c = local_c + 1) {
      printf("%10lu",s_pSesStore->pSynthesizedImp[local_c]);
    }
    printf("%10lu\n",s_pSesStore->nSynthesizedImp);
    printf(" - synth (res)            :");
    for (local_c = 0; local_c < 9; local_c = local_c + 1) {
      printf("%10lu",s_pSesStore->pSynthesizedRL[local_c]);
    }
    printf("%10lu\n",s_pSesStore->nSynthesizedRL);
    printf(" - not synth (imp)        :");
    for (local_c = 0; local_c < 9; local_c = local_c + 1) {
      printf("%10lu",s_pSesStore->pUnsynthesizedImp[local_c]);
    }
    printf("%10lu\n",s_pSesStore->nUnsynthesizedImp);
    printf(" - not synth (res)        :");
    for (local_c = 0; local_c < 9; local_c = local_c + 1) {
      printf("%10lu",s_pSesStore->pUnsynthesizedRL[local_c]);
    }
    printf("%10lu\n",s_pSesStore->nUnsynthesizedRL);
    printf(" - cache hits             :");
    for (local_c = 0; local_c < 9; local_c = local_c + 1) {
      printf("%10lu",s_pSesStore->pCacheHits[local_c]);
    }
    printf("%10lu\n",s_pSesStore->nCacheHits);
    printf(
          "-------------------------------------------------------------------------------------------------------------------------------\n"
          );
    printf("number of entries         : %d\n",(ulong)(uint)s_pSesStore->nEntriesCount);
    printf("number of valid entries   : %d\n",(ulong)(uint)s_pSesStore->nValidEntriesCount);
    printf("number of invalid entries : %d\n",
           (ulong)(uint)(s_pSesStore->nEntriesCount - s_pSesStore->nValidEntriesCount));
    printf(
          "-------------------------------------------------------------------------------------------------------------------------------\n"
          );
    printf("number of SAT calls       : %lu\n",s_pSesStore->nSatCalls);
    printf("number of UNSAT calls     : %lu\n",s_pSesStore->nUnsatCalls);
    printf("number of UNDEF calls     : %lu\n",s_pSesStore->nUndefCalls);
    printf(
          "-------------------------------------------------------------------------------------------------------------------------------\n"
          );
    printf("Runtime breakdown:\n");
    Abc_Print(1,"%s =","Exact    ");
    if (((double)s_pSesStore->timeTotal != 0.0) || (NAN((double)s_pSesStore->timeTotal))) {
      local_20 = ((double)s_pSesStore->timeExact * 100.0) / (double)s_pSesStore->timeTotal;
    }
    else {
      local_20 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)s_pSesStore->timeExact * 1.0) / 1000000.0,local_20
             );
    Abc_Print(1,"%s ="," Sat     ");
    if (((double)s_pSesStore->timeTotal != 0.0) || (NAN((double)s_pSesStore->timeTotal))) {
      local_30 = ((double)s_pSesStore->timeSat * 100.0) / (double)s_pSesStore->timeTotal;
    }
    else {
      local_30 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)s_pSesStore->timeSat * 1.0) / 1000000.0,local_30);
    Abc_Print(1,"%s =","  Sat    ");
    if (((double)s_pSesStore->timeTotal != 0.0) || (NAN((double)s_pSesStore->timeTotal))) {
      local_40 = ((double)s_pSesStore->timeSatSat * 100.0) / (double)s_pSesStore->timeTotal;
    }
    else {
      local_40 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)s_pSesStore->timeSatSat * 1.0) / 1000000.0,
              local_40);
    Abc_Print(1,"%s =","  Unsat  ");
    if (((double)s_pSesStore->timeTotal != 0.0) || (NAN((double)s_pSesStore->timeTotal))) {
      local_50 = ((double)s_pSesStore->timeSatUnsat * 100.0) / (double)s_pSesStore->timeTotal;
    }
    else {
      local_50 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)s_pSesStore->timeSatUnsat * 1.0) / 1000000.0,
              local_50);
    Abc_Print(1,"%s =","  Undef  ");
    if (((double)s_pSesStore->timeTotal != 0.0) || (NAN((double)s_pSesStore->timeTotal))) {
      local_60 = ((double)s_pSesStore->timeSatUndef * 100.0) / (double)s_pSesStore->timeTotal;
    }
    else {
      local_60 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)s_pSesStore->timeSatUndef * 1.0) / 1000000.0,
              local_60);
    Abc_Print(1,"%s ="," Instance");
    if (((double)s_pSesStore->timeTotal != 0.0) || (NAN((double)s_pSesStore->timeTotal))) {
      local_70 = ((double)s_pSesStore->timeInstance * 100.0) / (double)s_pSesStore->timeTotal;
    }
    else {
      local_70 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)s_pSesStore->timeInstance * 1.0) / 1000000.0,
              local_70);
    Abc_Print(1,"%s =","Other    ");
    if (((double)s_pSesStore->timeTotal != 0.0) || (NAN((double)s_pSesStore->timeTotal))) {
      local_80 = ((double)(s_pSesStore->timeTotal - s_pSesStore->timeExact) * 100.0) /
                 (double)s_pSesStore->timeTotal;
    }
    else {
      local_80 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",
              ((double)(s_pSesStore->timeTotal - s_pSesStore->timeExact) * 1.0) / 1000000.0,local_80
             );
    Abc_Print(1,"%s =","ALL      ");
    if (((double)s_pSesStore->timeTotal != 0.0) || (NAN((double)s_pSesStore->timeTotal))) {
      local_90 = ((double)s_pSesStore->timeTotal * 100.0) / (double)s_pSesStore->timeTotal;
    }
    else {
      local_90 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)s_pSesStore->timeTotal * 1.0) / 1000000.0,local_90
             );
  }
  return;
}

Assistant:

void Abc_ExactStats()
{
    int i;

    if ( !s_pSesStore )
    {
        printf( "BMS manager has not been started\n" );
        return;
    }

    printf( "-------------------------------------------------------------------------------------------------------------------------------\n" );
    printf( "                                    0         1         2         3         4         5         6         7         8     total\n" );
    printf( "-------------------------------------------------------------------------------------------------------------------------------\n" );
    printf( "number of considered cuts :" );
    for ( i = 0; i < 9; ++i )
        printf( "%10lu", s_pSesStore->pCutCount[i] );
    printf( "%10lu\n", s_pSesStore->nCutCount );
    printf( " - trivial                :" );
    for ( i = 0; i < 9; ++i )
        printf( "%10lu", s_pSesStore->pSynthesizedTrivial[i] );
    printf( "%10lu\n", s_pSesStore->nSynthesizedTrivial );
    printf( " - synth (imp)            :" );
    for ( i = 0; i < 9; ++i )
        printf( "%10lu", s_pSesStore->pSynthesizedImp[i] );
    printf( "%10lu\n", s_pSesStore->nSynthesizedImp );
    printf( " - synth (res)            :" );
    for ( i = 0; i < 9; ++i )
        printf( "%10lu", s_pSesStore->pSynthesizedRL[i] );
    printf( "%10lu\n", s_pSesStore->nSynthesizedRL );
    printf( " - not synth (imp)        :" );
    for ( i = 0; i < 9; ++i )
        printf( "%10lu", s_pSesStore->pUnsynthesizedImp[i] );
    printf( "%10lu\n", s_pSesStore->nUnsynthesizedImp );
    printf( " - not synth (res)        :" );
    for ( i = 0; i < 9; ++i )
        printf( "%10lu", s_pSesStore->pUnsynthesizedRL[i] );
    printf( "%10lu\n", s_pSesStore->nUnsynthesizedRL );
    printf( " - cache hits             :" );
    for ( i = 0; i < 9; ++i )
        printf( "%10lu", s_pSesStore->pCacheHits[i] );
    printf( "%10lu\n", s_pSesStore->nCacheHits );
    printf( "-------------------------------------------------------------------------------------------------------------------------------\n" );
    printf( "number of entries         : %d\n", s_pSesStore->nEntriesCount );
    printf( "number of valid entries   : %d\n", s_pSesStore->nValidEntriesCount );
    printf( "number of invalid entries : %d\n", s_pSesStore->nEntriesCount - s_pSesStore->nValidEntriesCount );
    printf( "-------------------------------------------------------------------------------------------------------------------------------\n" );
    printf( "number of SAT calls       : %lu\n", s_pSesStore->nSatCalls );
    printf( "number of UNSAT calls     : %lu\n", s_pSesStore->nUnsatCalls );
    printf( "number of UNDEF calls     : %lu\n", s_pSesStore->nUndefCalls );

    printf( "-------------------------------------------------------------------------------------------------------------------------------\n" );
    printf( "Runtime breakdown:\n" );
    ABC_PRTP( "Exact    ", s_pSesStore->timeExact,                          s_pSesStore->timeTotal );
    ABC_PRTP( " Sat     ", s_pSesStore->timeSat,                            s_pSesStore->timeTotal );
    ABC_PRTP( "  Sat    ", s_pSesStore->timeSatSat,                         s_pSesStore->timeTotal );
    ABC_PRTP( "  Unsat  ", s_pSesStore->timeSatUnsat,                       s_pSesStore->timeTotal );
    ABC_PRTP( "  Undef  ", s_pSesStore->timeSatUndef,                       s_pSesStore->timeTotal );
    ABC_PRTP( " Instance", s_pSesStore->timeInstance,                       s_pSesStore->timeTotal );
    ABC_PRTP( "Other    ", s_pSesStore->timeTotal - s_pSesStore->timeExact, s_pSesStore->timeTotal );
    ABC_PRTP( "ALL      ", s_pSesStore->timeTotal,                          s_pSesStore->timeTotal );
}